

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Treap.h
# Opt level: O2

void __thiscall Treap<unsigned_long>::insert(Treap<unsigned_long> *this,unsigned_long val)

{
  Node *pNVar1;
  pair<Treap<unsigned_long>::Node_*,_Treap<unsigned_long>::Node_*> pVar2;
  
  pNVar1 = (Node *)operator_new(0x20);
  Node::Node(pNVar1,val);
  pVar2 = split(this,this->root,val);
  pNVar1 = merge(this,pVar2.first,pNVar1);
  pNVar1 = merge(this,pNVar1,pVar2.second);
  this->root = pNVar1;
  return;
}

Assistant:

void insert(T val) {
    Node *newNode = new Node(val);
    auto t = split(root, val);
    t.first = merge(t.first, newNode);
    root = merge(t.first, t.second);
  }